

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O0

TestResult * receive_test_result(int waserror)

{
  FILE *__stream;
  RcvMsg *rmsg_00;
  TestResult *pTVar1;
  TestResult *result;
  RcvMsg *rmsg;
  FILE *fp;
  int waserror_local;
  
  __stream = (FILE *)get_pipe();
  if (__stream == (FILE *)0x0) {
    eprintf("Error in call to get_pipe",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
            ,0x7f);
  }
  rewind(__stream);
  rmsg_00 = punpack((FILE *)__stream);
  if (rmsg_00 == (RcvMsg *)0x0) {
    eprintf("Error in call to punpack",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
            ,0x85);
  }
  teardown_pipe();
  setup_pipe();
  pTVar1 = construct_test_result(rmsg_00,waserror);
  rcvmsg_free(rmsg_00);
  return pTVar1;
}

Assistant:

TestResult *receive_test_result(int waserror)
{
    FILE *fp;
    RcvMsg *rmsg;
    TestResult *result;

    fp = get_pipe();
    if(fp == NULL)
    {
        eprintf("Error in call to get_pipe", __FILE__, __LINE__ - 2);
    }

    rewind(fp);
    rmsg = punpack(fp);

    if(rmsg == NULL)
    {
        eprintf("Error in call to punpack", __FILE__, __LINE__ - 4);
    }

    teardown_pipe();
    setup_pipe();

    result = construct_test_result(rmsg, waserror);
    rcvmsg_free(rmsg);
    return result;
}